

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body.cc
# Opt level: O2

void __thiscall
apollonia::PolygonBody::PolygonBody(PolygonBody *this,Float mass,VertexList *vertices)

{
  float fVar1;
  pointer pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Float area;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  Body::Body(&this->super_Body,mass);
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__PolygonBody_0014acc0;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector(&this->vertices_,vertices);
  pVVar2 = (vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar3 = (long)(vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3;
  lVar4 = -lVar3;
  fVar7 = 0.0;
  fVar10 = 0.0;
  for (lVar5 = 1; lVar4 + lVar5 != 1; lVar5 = lVar5 + 1) {
    fVar11 = pVVar2[lVar5 + -1].x;
    fVar12 = pVVar2[lVar5 + -1].y;
    lVar6 = lVar5;
    if (lVar5 == lVar3) {
      lVar6 = 0;
    }
    fVar13 = pVVar2[lVar6].x;
    fVar1 = pVVar2[lVar6].y;
    fVar14 = ABS(fVar11 * fVar1 - fVar13 * fVar12);
    fVar10 = fVar10 + (fVar11 * fVar13 + fVar12 * fVar1 +
                      fVar13 * fVar13 + fVar1 * fVar1 + fVar11 * fVar11 + fVar12 * fVar12) * fVar14;
    fVar7 = fVar7 + fVar14;
  }
  fVar7 = ((fVar10 * mass) / 6.0) / fVar7;
  (this->super_Body).inertia_ = fVar7;
  (this->super_Body).inv_inertia_ = 1.0 / fVar7;
  auVar9 = ZEXT816(0);
  for (lVar5 = 1; lVar4 + lVar5 != 1; lVar5 = lVar5 + 1) {
    lVar6 = lVar5;
    if (lVar5 == lVar3) {
      lVar6 = 0;
    }
    fVar7 = pVVar2[lVar5 + -1].x;
    fVar10 = pVVar2[lVar5 + -1].y;
    fVar11 = pVVar2[lVar6].x;
    fVar13 = pVVar2[lVar6].y;
    fVar12 = fVar13 * fVar7 - fVar10 * fVar11;
    auVar8._0_4_ = auVar9._0_4_ + fVar12 * (fVar7 + fVar11);
    auVar8._4_4_ = auVar9._4_4_ + fVar12 * (fVar10 + fVar13);
    auVar8._8_4_ = auVar9._8_4_ + fVar12 * 0.0;
    auVar8._12_4_ = auVar9._12_4_ + fVar12 * 0.0;
    auVar9 = auVar8;
  }
  fVar7 = 0.0;
  for (lVar5 = 1; lVar4 + lVar5 != 1; lVar5 = lVar5 + 1) {
    lVar6 = lVar5;
    if (lVar5 == lVar3) {
      lVar6 = 0;
    }
    fVar7 = fVar7 + (pVVar2[lVar5 + -1].x * pVVar2[lVar6].y - pVVar2[lVar6].x * pVVar2[lVar5 + -1].y
                    );
  }
  auVar8 = divps(auVar9,_DAT_001222e0);
  auVar9._4_4_ = fVar7 * 0.5;
  auVar9._0_4_ = fVar7 * 0.5;
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar8,auVar9);
  (this->super_Body).centroid_ = auVar9._0_8_;
  return;
}

Assistant:

PolygonBody::PolygonBody(Float mass, const VertexList& vertices)
    : Body(mass), vertices_(vertices) {
  set_inertia(PolygonInertia(mass, vertices));
  set_centroid(PolygonCentroid(vertices));
}